

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void phmap::priv::(anonymous_namespace)::CheckPairEquals<std::__cxx11::string,std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *y)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  void *in_RDX;
  
  if (y == in_RCX) {
    if (y != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      iVar1 = bcmp(x,in_RDX,(size_t)y);
      if (iVar1 != 0) goto LAB_0012a867;
    }
    return;
  }
LAB_0012a867:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                ,0x49,
                "void phmap::priv::(anonymous namespace)::CheckPairEquals(const T &, const U &) [T = std::basic_string<char>, U = std::basic_string<char>]"
               );
}

Assistant:

void CheckPairEquals(const T &x, const U &y) {
        PHMAP_INTERNAL_CHECK(x == y, "Values are unequal.");
    }